

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

size_t jessilib::starts_with_lengthi<char,char>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  jessilib *pjVar4;
  jessilib *extraout_RDX;
  jessilib *this;
  jessilib *this_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  decode_result dVar6;
  decode_result dVar7;
  char *local_48;
  char *local_40;
  char *local_38;
  jessilib *pjVar5;
  
  local_38 = in_prefix._M_str;
  pjVar4 = (jessilib *)in_prefix._M_len;
  local_40 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pjVar4 <= this) {
    local_48 = (char *)0x0;
    this_00 = pjVar4;
    do {
      if ((this == (jessilib *)0x0) || (this_00 == (jessilib *)0x0)) {
        if (this_00 != (jessilib *)0x0) {
          return 0;
        }
        return (size_t)local_48;
      }
      in_string_00._M_str = (char *)pjVar4;
      in_string_00._M_len = (size_t)local_40;
      dVar6 = decode_codepoint_utf8<char>(this,in_string_00);
      in_string_01._M_str = (char *)dVar6.units;
      in_string_01._M_len = (size_t)local_38;
      dVar7 = decode_codepoint_utf8<char>(this_00,in_string_01);
      pjVar5 = (jessilib *)dVar7.units;
      bVar1 = false;
      pjVar4 = pjVar5;
      if ((in_string_01._M_str != (char *)0x0) && (pjVar5 != (jessilib *)0x0)) {
        if (dVar6.codepoint != dVar7.codepoint) {
          iVar2 = jessilib::fold(dVar6.codepoint);
          iVar3 = jessilib::fold(dVar7.codepoint);
          pjVar4 = extraout_RDX;
          if (iVar2 != iVar3) {
            bVar1 = false;
            goto LAB_001052fa;
          }
        }
        local_40 = local_40 + (long)in_string_01._M_str;
        this = this + -(long)in_string_01._M_str;
        local_38 = local_38 + (long)pjVar5;
        this_00 = this_00 + -(long)pjVar5;
        local_48 = local_48 + (long)in_string_01._M_str;
        bVar1 = true;
      }
LAB_001052fa:
    } while (bVar1);
  }
  return 0;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}